

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

char * anon_unknown.dwarf_1b0fcc::parse_discriminator(char *first,char *last)

{
  char cVar1;
  char *pcVar2;
  
  if (first != last) {
    if (*first == 0x5f) {
      if (first + 1 != last) {
        cVar1 = first[1];
        if ((int)cVar1 - 0x30U < 10) {
          return first + 2;
        }
        pcVar2 = first + 2;
        if (pcVar2 != last && cVar1 == '_') {
          do {
            cVar1 = *pcVar2;
            pcVar2 = pcVar2 + 1;
            if (9 < (int)cVar1 - 0x30U) {
              if (cVar1 == '_') {
                first = pcVar2;
              }
              return first;
            }
          } while (pcVar2 != last);
        }
      }
    }
    else if ((int)*first - 0x30U < 10) {
      pcVar2 = first + 1;
      do {
        if (pcVar2 == last) {
          return last;
        }
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while ((int)cVar1 - 0x30U < 10);
    }
  }
  return first;
}

Assistant:

const char*
parse_discriminator(const char* first, const char* last)
{
    // parse but ignore discriminator
    if (first != last)
    {
        if (*first == '_')
        {
            const char* t1 = first+1;
            if (t1 != last)
            {
                if (std::isdigit(*t1))
                    first = t1+1;
                else if (*t1 == '_')
                {
                    for (++t1; t1 != last && std::isdigit(*t1); ++t1)
                        ;
                    if (t1 != last && *t1 == '_')
                        first = t1 + 1;
                }
            }
        }
        else if (std::isdigit(*first))
        {
            const char* t1 = first+1;
            for (; t1 != last && std::isdigit(*t1); ++t1)
                ;
            if (t1 == last)
                first = last;
        }
    }
    return first;
}